

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.cpp
# Opt level: O0

Tag * __thiscall jaegertracing::thrift::Tag::operator=(Tag *this,Tag *other2)

{
  Tag *other2_local;
  Tag *this_local;
  
  std::__cxx11::string::operator=((string *)&this->key,(string *)&other2->key);
  this->vType = other2->vType;
  std::__cxx11::string::operator=((string *)&this->vStr,(string *)&other2->vStr);
  this->vDouble = other2->vDouble;
  this->vBool = (bool)(other2->vBool & 1);
  this->vLong = other2->vLong;
  std::__cxx11::string::operator=((string *)&this->vBinary,(string *)&other2->vBinary);
  this->__isset = other2->__isset;
  return this;
}

Assistant:

Tag& Tag::operator=(const Tag& other2) {
  key = other2.key;
  vType = other2.vType;
  vStr = other2.vStr;
  vDouble = other2.vDouble;
  vBool = other2.vBool;
  vLong = other2.vLong;
  vBinary = other2.vBinary;
  __isset = other2.__isset;
  return *this;
}